

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.h
# Opt level: O1

void * llvm::object_creator<llvm::cl::SubCommand>::call(void)

{
  void *__s;
  
  __s = operator_new(0xa8);
  memset(__s,0,0xa8);
  *(long *)((long)__s + 0x20) = (long)__s + 0x30;
  *(undefined8 *)((long)__s + 0x28) = 0x400000000;
  *(long *)((long)__s + 0x50) = (long)__s + 0x60;
  *(undefined8 *)((long)__s + 0x58) = 0x400000000;
  *(undefined8 *)((long)__s + 0x80) = 0;
  *(undefined8 *)((long)__s + 0x88) = 0;
  *(undefined8 *)((long)__s + 0x90) = 0x1000000000;
  *(undefined8 *)((long)__s + 0xa0) = 0;
  return __s;
}

Assistant:

static void *call() { return new C(); }